

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLap_3D_K.H
# Opt level: O2

void amrex::mlndlap_bc_doit<int>
               (Box *vbx,Array4<int> *a,Box *domain,GpuArray<bool,_3U> *bflo,
               GpuArray<bool,_3U> *bfhi)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  bool bVar9;
  bool bVar10;
  int idim;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  int *piVar19;
  uint uVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  int *piVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  uint uVar30;
  int iVar31;
  undefined4 uVar32;
  int iVar33;
  int iVar34;
  long lVar35;
  long lVar36;
  char cVar37;
  int iVar38;
  int iVar39;
  long lVar40;
  long lVar41;
  char cVar42;
  long lVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  long lVar48;
  int iVar49;
  long lVar50;
  bool bVar51;
  Box gdomain;
  int local_128;
  int local_11c;
  int local_118;
  int local_114;
  int local_e0;
  IntVect local_7c;
  long local_70;
  ulong local_68;
  ulong local_60;
  Box local_58;
  
  uVar8 = *(undefined8 *)((domain->smallend).vect + 2);
  local_58.bigend.vect[1] = (int)((ulong)*(undefined8 *)(domain->bigend).vect >> 0x20);
  local_58._20_8_ = *(undefined8 *)((domain->bigend).vect + 2);
  local_58.smallend.vect._0_8_ = *(undefined8 *)(domain->smallend).vect;
  local_58.smallend.vect[2] = (int)uVar8;
  local_58.bigend.vect[0] = (int)((ulong)uVar8 >> 0x20);
  for (lVar18 = 0; lVar18 != 3; lVar18 = lVar18 + 1) {
    if (bflo->arr[lVar18] == false) {
      piVar19 = local_58.smallend.vect + lVar18;
      *piVar19 = *piVar19 + -1;
    }
    if (bfhi->arr[lVar18] == false) {
      piVar19 = local_58.bigend.vect + lVar18;
      *piVar19 = *piVar19 + 1;
    }
  }
  bVar9 = Box::strictly_contains(&local_58,vbx);
  if (!bVar9) {
    bVar9 = (domain->btype).itype != 0;
    iVar22 = (domain->smallend).vect[0];
    iVar3 = (domain->bigend).vect[0];
    iVar4 = (vbx->smallend).vect[0];
    iVar49 = (vbx->smallend).vect[1];
    iVar44 = (vbx->smallend).vect[2];
    iVar5 = (vbx->bigend).vect[0];
    iVar6 = (vbx->bigend).vect[1];
    iVar7 = (vbx->bigend).vect[2];
    lVar18 = (long)iVar22 + -1;
    iVar26 = (domain->smallend).vect[1] + -1;
    lVar27 = (long)(domain->smallend).vect[2] + -1;
    iVar31 = (domain->bigend).vect[1] + 1;
    lVar40 = (long)(domain->bigend).vect[2] + 1;
    uVar20 = (uint)bVar9;
    uVar30 = iVar4 - 1;
    local_60 = (ulong)uVar30;
    lVar35 = (long)(int)uVar30;
    lVar36 = lVar35 * 4;
    iVar1 = iVar49 + -1;
    local_68 = (ulong)((iVar49 - uVar20) - 2);
    iVar49 = iVar44 + -1;
    iVar44 = (iVar44 - uVar20) + -2;
    iVar45 = bVar9 + 1;
    local_118 = iVar49 + iVar45;
    local_70 = (long)iVar1;
    iVar22 = iVar22 - iVar4;
    iVar11 = (iVar4 - uVar20) + -2;
    iVar29 = (iVar3 - iVar4) + 2;
    iVar4 = (int)lVar18;
    iVar12 = (uint)bVar9 + iVar4 + 1;
    iVar13 = uVar30 + iVar45;
    for (lVar50 = (long)iVar49; iVar49 = (int)lVar50, iVar49 <= iVar7 + 1; lVar50 = lVar50 + 1) {
      iVar14 = ~(uint)bVar9 + iVar49;
      iVar15 = iVar45 + iVar49;
      local_11c = (int)local_68;
      local_114 = iVar1 + iVar45;
      for (lVar48 = local_70; iVar47 = (int)lVar48, iVar47 <= iVar6 + 1; lVar48 = lVar48 + 1) {
        iVar38 = (int)lVar40;
        local_128 = (int)lVar27;
        iVar16 = ~(uint)bVar9 + iVar47;
        iVar17 = iVar45 + iVar47;
        lVar25 = 0;
        while( true ) {
          iVar33 = (int)lVar25;
          local_7c.vect[0] = (int)local_60 + iVar33;
          if (iVar5 + 1 < local_7c.vect[0]) break;
          local_7c.vect[1] = iVar47;
          local_7c.vect[2] = iVar49;
          bVar10 = Box::contains(&local_58,&local_7c);
          if (!bVar10) {
            bVar10 = iVar22 != iVar33;
            if ((iVar47 != iVar26 || bVar10) || (iVar49 != local_128)) {
LAB_0053e814:
              bVar51 = iVar29 != iVar33;
              iVar34 = local_128;
              if ((iVar47 != iVar26 || bVar51) || (iVar49 != local_128)) {
LAB_0053e959:
                if ((bVar10 || iVar47 != iVar31) || (iVar49 != local_128)) {
LAB_0053e9ac:
                  if ((!bVar51 && iVar47 == iVar31) && (iVar49 == local_128)) {
                    cVar42 = bfhi->arr[1];
                    cVar37 = bflo->arr[2];
                    if (bfhi->arr[0] != false) {
                      piVar19 = a->p;
                      lVar23 = a->jstride;
                      iVar34 = (a->begin).x;
                      iVar39 = iVar11;
                      goto LAB_0053e9f3;
                    }
                    if ((bool)cVar42 != false) goto LAB_0053eb72;
                    if ((bool)cVar37 != false) goto LAB_0053ec68;
                  }
                  if ((iVar47 != iVar26 || bVar10) || iVar49 != iVar38) {
LAB_0053ece4:
                    if ((iVar47 != iVar26 || bVar51) || iVar49 != iVar38) {
LAB_0053ecf4:
                      if ((!bVar10 && iVar47 == iVar31) && iVar49 == iVar38) {
                        cVar37 = bfhi->arr[1];
                        cVar42 = bfhi->arr[2];
                        if (bflo->arr[0] != false) {
                          piVar19 = a->p;
                          lVar23 = a->jstride;
                          iVar34 = (a->begin).x;
                          iVar39 = iVar13;
LAB_0053f098:
                          lVar21 = (long)iVar34;
                          lVar43 = (long)((iVar39 + iVar33) - iVar34);
                          iVar33 = (a->begin).y;
                          iVar34 = (a->begin).z;
                          lVar28 = a->kstride;
                          if (cVar37 == '\0') {
                            lVar23 = lVar23 * (iVar31 - iVar33);
                            piVar24 = piVar19 + lVar23 + lVar43;
                            if (cVar42 == '\0') {
                              iVar33 = iVar38 - iVar34;
                              goto LAB_0053eacc;
                            }
                            iVar39 = piVar24[(iVar14 - iVar34) * lVar28];
                            iVar33 = iVar38;
                            goto LAB_0053eb0d;
                          }
                          piVar24 = piVar19 + (iVar16 - iVar33) * lVar23 + lVar43;
                          lVar43 = (long)(iVar31 - iVar33);
                          if (cVar42 == '\0') {
                            iVar33 = iVar38 - iVar34;
                            goto LAB_0053eaa0;
                          }
                          iVar39 = piVar24[(iVar14 - iVar34) * lVar28];
                          lVar28 = (iVar38 - iVar34) * lVar28;
                          lVar23 = lVar23 * lVar43;
                          goto LAB_0053eb17;
                        }
                        if ((bool)cVar37 != false) {
LAB_0053f267:
                          piVar19 = a->p;
                          lVar28 = a->jstride;
                          lVar21 = (long)(a->begin).x;
                          iVar33 = (a->begin).y;
                          iVar39 = (a->begin).z;
                          lVar23 = a->kstride;
                          lVar43 = (long)(iVar31 - iVar33);
                          if (cVar42 != '\0') {
                            lVar23 = lVar23 * 4;
                            lVar28 = lVar28 * 4;
                            piVar19 = piVar19 + lVar35;
                            uVar32 = *(undefined4 *)
                                      ((long)piVar19 +
                                      lVar25 * 4 +
                                      (local_11c - iVar33) * lVar28 + (iVar44 - iVar39) * lVar23 +
                                      lVar21 * -4);
                            iVar33 = iVar38;
                            goto LAB_0053e7b7;
                          }
                          iVar39 = iVar38 - iVar39;
                          goto LAB_0053ec1b;
                        }
                        if ((bool)cVar42 == false) goto LAB_0053ed04;
LAB_0053f43a:
                        if (bfhi->arr[2] != true) goto LAB_0053ec5b;
LAB_0053f449:
                        lVar23 = (long)(a->begin).x;
                        iVar33 = (a->begin).z;
                        lVar28 = ((long)iVar31 - (long)(a->begin).y) * a->jstride;
                        lVar21 = a->kstride * 4;
                        piVar19 = a->p + lVar35;
                        uVar32 = *(undefined4 *)
                                  ((long)piVar19 +
                                  lVar25 * 4 + (iVar44 - iVar33) * lVar21 + lVar28 * 4 + lVar23 * -4
                                  );
                        iVar34 = iVar38;
                        goto LAB_0053ecb6;
                      }
LAB_0053ed04:
                      if ((!bVar51 && iVar47 == iVar31) && iVar49 == iVar38) {
                        cVar37 = bfhi->arr[1];
                        cVar42 = bfhi->arr[2];
                        if (bfhi->arr[0] != false) {
                          piVar19 = a->p;
                          lVar23 = a->jstride;
                          iVar34 = (a->begin).x;
                          iVar39 = iVar11;
                          goto LAB_0053f098;
                        }
                        if ((bool)cVar37 != false) goto LAB_0053f267;
                        if ((bool)cVar42 != false) goto LAB_0053f43a;
                      }
                      lVar23 = (long)iVar49;
                      if ((iVar22 != iVar33) || (iVar47 != iVar26)) {
LAB_0053f39d:
                        local_e0 = (int)((long)iVar3 + 1);
                        uVar30 = (uint)bVar9;
                        if ((iVar29 == iVar33) && (iVar47 == iVar26)) {
                          if (bfhi->arr[0] == false) {
                            if (bflo->arr[1] != false) {
                              iVar33 = (a->begin).x;
                              lVar28 = (long)iVar3 + 1;
                              goto LAB_0053f4a4;
                            }
                            goto LAB_0053f4f3;
                          }
                          piVar19 = a->p;
                          lVar28 = a->jstride;
                          iVar33 = (a->begin).x;
                          lVar43 = (long)(int)(iVar3 - (uVar30 + iVar33));
                          iVar34 = (a->begin).y;
                          lVar23 = (lVar23 - (a->begin).z) * a->kstride;
                          lVar21 = (long)(local_e0 - iVar33);
                          if (bflo->arr[1] == false) {
                            iVar34 = iVar26 - iVar34;
LAB_0053f89c:
                            piVar19 = piVar19 + lVar28 * iVar34;
                            piVar24 = piVar19 + lVar43;
                            goto LAB_0053f8a8;
                          }
                          iVar33 = piVar19[(iVar17 - iVar34) * lVar28 + lVar43 + lVar23];
                          iVar34 = iVar26 - iVar34;
LAB_0053f69a:
                          piVar19 = piVar19 + iVar34 * lVar28 + lVar21;
LAB_0053f6a6:
                          piVar19[lVar23] = iVar33;
                          goto LAB_0053ec5b;
                        }
LAB_0053f4f3:
                        lVar28 = (long)iVar4;
                        if ((iVar22 == iVar33) && (iVar47 == iVar31)) {
                          if (bflo->arr[0] != false) {
                            piVar19 = a->p;
                            lVar28 = a->jstride;
                            iVar34 = (a->begin).x;
                            iVar33 = (a->begin).y;
                            lVar23 = (lVar23 - (a->begin).z) * a->kstride;
                            lVar21 = (long)(iVar4 - iVar34);
                            iVar39 = iVar31;
                            if (bfhi->arr[1] != false) {
                              iVar34 = piVar19[(iVar16 - iVar33) * lVar28 +
                                               (iVar12 - iVar34) + lVar23];
                              goto LAB_0053f57d;
                            }
                            goto LAB_0053f7aa;
                          }
                          if (bfhi->arr[1] == false) goto LAB_0053f602;
                          lVar28 = lVar28 - (a->begin).x;
                          iVar33 = (a->begin).y;
                          lVar23 = (lVar23 - (a->begin).z) * a->kstride;
                          iVar34 = a->p[(long)(iVar16 - iVar33) * a->jstride + lVar28 + lVar23];
                          piVar19 = a->p + (long)(iVar31 - iVar33) * a->jstride + lVar28;
                          goto LAB_0053f8af;
                        }
LAB_0053f602:
                        lVar21 = (long)local_e0;
                        if ((iVar29 == iVar33) && (iVar47 == iVar31)) {
                          if (bfhi->arr[0] != false) {
                            piVar19 = a->p;
                            lVar28 = a->jstride;
                            iVar33 = (a->begin).x;
                            lVar43 = (long)(int)(iVar3 - (uVar30 + iVar33));
                            iVar34 = (a->begin).y;
                            lVar23 = (lVar23 - (a->begin).z) * a->kstride;
                            lVar21 = (long)(local_e0 - iVar33);
                            if (bfhi->arr[1] == false) {
                              iVar34 = iVar31 - iVar34;
                              goto LAB_0053f89c;
                            }
                            iVar33 = piVar19[(iVar16 - iVar34) * lVar28 + lVar43 + lVar23];
                            iVar34 = iVar31 - iVar34;
                            goto LAB_0053f69a;
                          }
                          if (bfhi->arr[1] != false) {
                            lVar21 = lVar21 - (a->begin).x;
                            iVar33 = (a->begin).y;
                            lVar23 = (lVar23 - (a->begin).z) * a->kstride;
                            iVar34 = a->p[(long)(iVar16 - iVar33) * a->jstride + lVar21 + lVar23];
                            piVar19 = a->p + (long)(iVar31 - iVar33) * a->jstride + lVar21;
                            goto LAB_0053f8af;
                          }
                        }
                        lVar43 = (long)iVar47;
                        if ((iVar22 == iVar33) && (iVar49 == local_128)) {
                          if (bflo->arr[0] != false) {
                            iVar34 = (a->begin).x;
                            iVar33 = (a->begin).z;
                            lVar23 = a->kstride;
                            piVar19 = a->p + (lVar43 - (a->begin).y) * a->jstride;
                            lVar28 = (long)(iVar4 - iVar34);
                            iVar39 = local_128;
                            if (bflo->arr[2] == false) {
LAB_0053fb5e:
                              lVar23 = lVar23 * (iVar39 - iVar33);
                              piVar19[lVar28 + lVar23] = piVar19[(iVar12 - iVar34) + lVar23];
                              goto LAB_0053ec5b;
                            }
                            iVar34 = piVar19[(long)(iVar12 - iVar34) + (iVar15 - iVar33) * lVar23];
LAB_0053f980:
                            piVar19[lVar28 + (iVar39 - iVar33) * lVar23] = iVar34;
                            goto LAB_0053ec5b;
                          }
                          if (bflo->arr[2] == false) goto LAB_0053f7fe;
                          iVar33 = (a->begin).z;
                          lVar23 = a->kstride;
                          lVar41 = (iVar15 - iVar33) * lVar23;
                          piVar19 = a->p + (lVar43 - (a->begin).y) * a->jstride +
                                           (lVar28 - (a->begin).x);
LAB_0053f8ef:
                          iVar34 = piVar19[lVar41];
                          iVar39 = local_128;
LAB_0053fade:
                          piVar19[(iVar39 - iVar33) * lVar23] = iVar34;
                          goto LAB_0053ec5b;
                        }
LAB_0053f7fe:
                        if ((iVar29 == iVar33) && (iVar49 == local_128)) {
                          if (bfhi->arr[0] == false) {
                            if (bflo->arr[2] != false) {
                              iVar33 = (a->begin).z;
                              lVar23 = a->kstride;
                              lVar41 = (iVar15 - iVar33) * lVar23;
                              piVar19 = a->p + (lVar43 - (a->begin).y) * a->jstride +
                                               (lVar21 - (a->begin).x);
                              goto LAB_0053f8ef;
                            }
                            goto LAB_0053f8fc;
                          }
                          iVar33 = (a->begin).x;
                          iVar39 = iVar3 - (uVar30 + iVar33);
                          iVar34 = (a->begin).z;
                          lVar23 = a->kstride;
                          piVar19 = a->p + (lVar43 - (a->begin).y) * a->jstride;
                          lVar28 = (long)(local_e0 - iVar33);
                          if (bflo->arr[2] == false) {
                            lVar23 = lVar23 * (local_128 - iVar34);
                            iVar33 = piVar19[iVar39 + lVar23];
LAB_0053fc1f:
                            piVar19[lVar28 + lVar23] = iVar33;
                            goto LAB_0053ec5b;
                          }
                          iVar33 = piVar19[(long)iVar39 + (iVar15 - iVar34) * lVar23];
                          iVar39 = local_128;
LAB_0053fa74:
                          lVar23 = (iVar39 - iVar34) * lVar23;
                          piVar19 = piVar19 + lVar28;
                          goto LAB_0053f6a6;
                        }
LAB_0053f8fc:
                        if ((iVar22 == iVar33) && (iVar49 == iVar38)) {
                          if (bflo->arr[0] != false) {
                            iVar34 = (a->begin).x;
                            iVar33 = (a->begin).z;
                            lVar23 = a->kstride;
                            piVar19 = a->p + (lVar43 - (a->begin).y) * a->jstride;
                            lVar28 = (long)(iVar4 - iVar34);
                            iVar39 = iVar38;
                            if (bfhi->arr[2] == false) goto LAB_0053fb5e;
                            iVar34 = piVar19[(long)(iVar12 - iVar34) + (iVar14 - iVar33) * lVar23];
                            goto LAB_0053f980;
                          }
                          if (bfhi->arr[2] == false) goto LAB_0053f9e8;
                          iVar33 = (a->begin).z;
                          lVar23 = a->kstride;
                          lVar41 = (iVar14 - iVar33) * lVar23;
                          piVar19 = a->p + (lVar43 - (a->begin).y) * a->jstride +
                                           (lVar28 - (a->begin).x);
LAB_0053fad6:
                          iVar34 = piVar19[lVar41];
                          iVar39 = iVar38;
                          goto LAB_0053fade;
                        }
LAB_0053f9e8:
                        if ((iVar29 == iVar33) && (iVar49 == iVar38)) {
                          if (bfhi->arr[0] != false) {
                            iVar33 = (a->begin).x;
                            iVar39 = iVar3 - (uVar30 + iVar33);
                            iVar34 = (a->begin).z;
                            lVar23 = a->kstride;
                            piVar19 = a->p + (lVar43 - (a->begin).y) * a->jstride;
                            lVar28 = (long)(local_e0 - iVar33);
                            if (bfhi->arr[2] == false) {
                              lVar23 = lVar23 * (iVar38 - iVar34);
                              iVar33 = piVar19[iVar39 + lVar23];
                              goto LAB_0053fc1f;
                            }
                            iVar33 = piVar19[(long)iVar39 + (iVar14 - iVar34) * lVar23];
                            iVar39 = iVar38;
                            goto LAB_0053fa74;
                          }
                          if (bfhi->arr[2] != false) {
                            iVar33 = (a->begin).z;
                            lVar23 = a->kstride;
                            lVar41 = (iVar14 - iVar33) * lVar23;
                            piVar19 = a->p + (lVar43 - (a->begin).y) * a->jstride +
                                             (lVar21 - (a->begin).x);
                            goto LAB_0053fad6;
                          }
                        }
                        if (iVar47 != iVar26 || iVar49 != local_128) {
LAB_0053fb84:
                          if (iVar49 != local_128 || iVar47 != iVar31) {
LAB_0053fc34:
                            if (iVar47 == iVar26 && iVar49 == iVar38) {
                              if (bflo->arr[1] != false) {
                                piVar19 = a->p;
                                lVar28 = a->jstride;
                                lVar21 = (long)(a->begin).x;
                                iVar34 = (a->begin).y;
                                iVar33 = (a->begin).z;
                                lVar43 = (long)(iVar26 - iVar34);
                                if (bfhi->arr[2] != false) {
                                  lVar23 = a->kstride * 4;
                                  lVar28 = lVar28 * 4;
                                  piVar19 = piVar19 + lVar35;
                                  uVar32 = *(undefined4 *)
                                            ((long)piVar19 +
                                            lVar25 * 4 +
                                            (local_114 - iVar34) * lVar28 +
                                            (iVar44 - iVar33) * lVar23 + lVar21 * -4);
                                  goto LAB_0053ef38;
                                }
                                lVar23 = a->kstride * (long)(iVar38 - iVar33);
                                goto LAB_0053f30b;
                              }
                              if (bfhi->arr[2] != false) goto LAB_0053f190;
                            }
                            if (iVar47 == iVar31 && iVar49 == iVar38) {
                              if (bfhi->arr[1] != false) {
                                piVar19 = a->p;
                                lVar28 = a->jstride;
                                lVar21 = (long)(a->begin).x;
                                iVar33 = (a->begin).y;
                                iVar39 = (a->begin).z;
                                lVar23 = a->kstride;
                                lVar43 = (long)(iVar31 - iVar33);
                                iVar34 = iVar38;
                                if (bfhi->arr[2] != false) {
                                  lVar23 = lVar23 * 4;
                                  lVar28 = lVar28 * 4;
                                  piVar19 = piVar19 + lVar35;
                                  uVar32 = *(undefined4 *)
                                            ((long)piVar19 +
                                            lVar25 * 4 +
                                            (local_11c - iVar33) * lVar28 +
                                            (iVar44 - iVar39) * lVar23 + lVar21 * -4);
                                  goto LAB_0053ebd9;
                                }
                                goto LAB_00540004;
                              }
                              if (bfhi->arr[2] != false) goto LAB_0053f449;
                            }
                            if ((iVar22 == iVar33) && (bflo->arr[0] == true)) {
                              local_e0 = (a->begin).x;
                              lVar23 = (lVar23 - (a->begin).z) * a->kstride;
                              piVar19 = a->p + (lVar43 - (a->begin).y) * a->jstride;
                              iVar34 = piVar19[(iVar12 - local_e0) + lVar23];
                              local_e0 = iVar4 - local_e0;
                            }
                            else {
                              if ((iVar29 != iVar33) || (bfhi->arr[0] != true)) {
                                if ((iVar47 == iVar26) && (bflo->arr[1] == true)) {
                                  lVar23 = (long)(a->begin).x;
                                  iVar33 = (a->begin).y;
                                  lVar21 = (lVar50 - (a->begin).z) * a->kstride;
                                  lVar28 = a->jstride * 4;
                                  piVar19 = a->p + lVar35;
                                  uVar32 = *(undefined4 *)
                                            ((long)piVar19 +
                                            lVar25 * 4 +
                                            (local_114 - iVar33) * lVar28 + lVar21 * 4 + lVar23 * -4
                                            );
                                  iVar34 = iVar26;
                                }
                                else {
                                  if ((iVar47 != iVar31) || (bfhi->arr[1] != true)) {
                                    if ((iVar49 == local_128) && (bflo->arr[2] == true)) {
                                      lVar23 = (long)(a->begin).x;
                                      iVar33 = (a->begin).z;
                                      lVar21 = (lVar48 - (a->begin).y) * a->jstride;
                                      lVar28 = a->kstride * 4;
                                      piVar19 = a->p + lVar35;
                                      uVar32 = *(undefined4 *)
                                                ((long)piVar19 +
                                                lVar25 * 4 +
                                                (local_118 - iVar33) * lVar28 + lVar21 * 4 +
                                                lVar23 * -4);
                                    }
                                    else {
                                      if ((iVar49 != iVar38) || (bfhi->arr[2] != true))
                                      goto LAB_0053ec5b;
                                      lVar23 = (long)(a->begin).x;
                                      iVar33 = (a->begin).z;
                                      lVar21 = (lVar48 - (a->begin).y) * a->jstride;
                                      lVar28 = a->kstride * 4;
                                      piVar19 = a->p + lVar35;
                                      uVar32 = *(undefined4 *)
                                                ((long)piVar19 +
                                                lVar25 * 4 +
                                                (iVar44 - iVar33) * lVar28 + lVar21 * 4 +
                                                lVar23 * -4);
                                      iVar34 = iVar38;
                                    }
                                    *(undefined4 *)
                                     ((long)piVar19 +
                                     lVar25 * 4 +
                                     (iVar34 - iVar33) * lVar28 + lVar21 * 4 + lVar23 * -4) = uVar32
                                    ;
                                    goto LAB_0053ec5b;
                                  }
                                  lVar23 = (long)(a->begin).x;
                                  iVar33 = (a->begin).y;
                                  lVar21 = (lVar50 - (a->begin).z) * a->kstride;
                                  lVar28 = a->jstride * 4;
                                  piVar19 = a->p + lVar35;
                                  uVar32 = *(undefined4 *)
                                            ((long)piVar19 +
                                            lVar25 * 4 +
                                            (local_11c - iVar33) * lVar28 + lVar21 * 4 + lVar23 * -4
                                            );
                                  iVar34 = iVar31;
                                }
                                *(undefined4 *)
                                 ((long)piVar19 +
                                 lVar25 * 4 + (iVar34 - iVar33) * lVar28 + lVar21 * 4 + lVar23 * -4)
                                     = uVar32;
                                goto LAB_0053ec5b;
                              }
                              iVar33 = (a->begin).x;
                              lVar23 = (lVar23 - (a->begin).z) * a->kstride;
                              piVar19 = a->p + (lVar43 - (a->begin).y) * a->jstride;
                              iVar34 = piVar19[(int)(iVar3 - (uVar30 + iVar33)) + lVar23];
                              local_e0 = local_e0 - iVar33;
                            }
                            piVar19 = piVar19 + local_e0;
                            goto LAB_0053f8af;
                          }
                          if (bfhi->arr[1] == false) {
                            if (bflo->arr[2] != false) goto LAB_0053ec6f;
                            goto LAB_0053fc34;
                          }
                          piVar19 = a->p;
                          lVar28 = a->jstride;
                          lVar21 = (long)(a->begin).x;
                          iVar33 = (a->begin).y;
                          iVar39 = (a->begin).z;
                          lVar23 = a->kstride;
                          lVar43 = (long)(iVar31 - iVar33);
                          if (bflo->arr[2] != false) {
                            lVar23 = lVar23 * 4;
                            lVar41 = (local_118 - iVar39) * lVar23;
                            iVar46 = local_11c;
                            goto LAB_0053fbe8;
                          }
LAB_00540004:
                          lVar23 = lVar23 * (iVar34 - iVar39);
                          iVar34 = local_11c;
                        }
                        else {
                          if (bflo->arr[1] == false) {
                            if (bflo->arr[2] != false) goto LAB_0053e8f9;
                            goto LAB_0053fb84;
                          }
                          piVar19 = a->p;
                          lVar28 = a->jstride;
                          lVar21 = (long)(a->begin).x;
                          iVar33 = (a->begin).y;
                          iVar39 = (a->begin).z;
                          lVar43 = (long)(iVar26 - iVar33);
                          if (bflo->arr[2] != false) {
                            lVar23 = a->kstride * 4;
                            lVar41 = (local_118 - iVar39) * lVar23;
                            iVar46 = local_114;
LAB_0053fbe8:
                            lVar28 = lVar28 * 4;
                            piVar19 = piVar19 + lVar35;
                            uVar32 = *(undefined4 *)
                                      ((long)piVar19 +
                                      lVar25 * 4 + (iVar46 - iVar33) * lVar28 + lVar41 + lVar21 * -4
                                      );
                            goto LAB_0053ebd9;
                          }
                          lVar23 = a->kstride * (long)(local_128 - iVar39);
                          iVar34 = local_114;
                        }
                        iVar34 = iVar34 - iVar33;
                        goto LAB_0053ec2b;
                      }
                      if (bflo->arr[0] == false) {
                        if (bflo->arr[1] == false) goto LAB_0053f39d;
                        iVar33 = (a->begin).x;
                        lVar28 = lVar18;
LAB_0053f4a4:
                        iVar34 = (a->begin).y;
                        lVar23 = (lVar23 - (a->begin).z) * a->kstride;
                        a->p[(long)(iVar26 - iVar34) * a->jstride + (lVar28 - iVar33) + lVar23] =
                             a->p[(long)(iVar17 - iVar34) * a->jstride + (lVar28 - iVar33) + lVar23]
                        ;
                        goto LAB_0053ec5b;
                      }
                      piVar19 = a->p;
                      lVar28 = a->jstride;
                      iVar34 = (a->begin).x;
                      iVar33 = (a->begin).y;
                      lVar23 = (lVar23 - (a->begin).z) * a->kstride;
                      lVar21 = (long)(iVar4 - iVar34);
                      iVar39 = iVar26;
                      if (bflo->arr[1] != false) {
                        iVar34 = piVar19[(iVar17 - iVar33) * lVar28 + (iVar12 - iVar34) + lVar23];
LAB_0053f57d:
                        piVar19[(iVar39 - iVar33) * lVar28 + lVar21 + lVar23] = iVar34;
                        goto LAB_0053ec5b;
                      }
LAB_0053f7aa:
                      piVar19 = piVar19 + lVar28 * (iVar39 - iVar33);
                      piVar24 = piVar19 + (iVar12 - iVar34);
LAB_0053f8a8:
                      iVar34 = piVar24[lVar23];
                      piVar19 = piVar19 + lVar21;
LAB_0053f8af:
                      piVar19[lVar23] = iVar34;
                    }
                    else {
                      bVar2 = bfhi->arr[2];
                      if (bfhi->arr[0] != false) {
                        piVar19 = a->p;
                        lVar23 = a->jstride;
                        iVar34 = (a->begin).x;
                        lVar21 = (long)iVar34;
                        lVar43 = (long)((iVar11 + iVar33) - iVar34);
                        iVar33 = (a->begin).y;
                        iVar34 = (a->begin).z;
                        lVar28 = a->kstride;
                        if (bflo->arr[1] == false) {
                          lVar23 = lVar23 * (iVar26 - iVar33);
                          if (bVar2 != false) {
                            iVar39 = piVar19[lVar23 + lVar43 + (iVar14 - iVar34) * lVar28];
                            goto LAB_0053f162;
                          }
                          lVar28 = lVar28 * (iVar38 - iVar34);
                          iVar34 = piVar19[lVar23 + lVar43 + lVar28];
                        }
                        else {
                          lVar41 = (iVar17 - iVar33) * lVar23;
                          if (bVar2 != false) {
                            iVar39 = piVar19[lVar41 + lVar43 + (iVar14 - iVar34) * lVar28];
                            lVar23 = lVar23 * (iVar26 - iVar33);
LAB_0053f162:
                            lVar23 = (iVar38 - iVar34) * lVar28 * 4 + lVar23 * 4;
                            goto LAB_0053eb1f;
                          }
                          lVar28 = lVar28 * (iVar38 - iVar34);
                          iVar34 = piVar19[lVar41 + lVar43 + lVar28];
                          lVar23 = lVar23 * (iVar26 - iVar33);
                        }
LAB_0053f353:
                        lVar23 = lVar28 * 4 + lVar23 * 4;
                        goto LAB_0053eb52;
                      }
                      if (bflo->arr[1] == false) {
                        if (bVar2 != false) goto LAB_0053f181;
                        goto LAB_0053ecf4;
                      }
                      piVar19 = a->p;
                      lVar28 = a->jstride;
                      lVar21 = (long)(a->begin).x;
                      iVar34 = (a->begin).y;
                      iVar33 = (a->begin).z;
                      lVar23 = a->kstride;
                      lVar43 = (long)(iVar26 - iVar34);
                      if (bVar2 != false) {
                        *(undefined4 *)
                         ((long)piVar19 +
                         lVar25 * 4 +
                         (long)(iVar38 - iVar33) * lVar23 * 4 + lVar28 * 4 * lVar43 + lVar21 * -4 +
                         lVar36) = *(undefined4 *)
                                    ((long)piVar19 +
                                    lVar25 * 4 +
                                    (long)(local_114 - iVar34) * lVar28 * 4 +
                                    (long)(iVar44 - iVar33) * lVar23 * 4 + lVar21 * -4 + lVar36);
                        goto LAB_0053ec5b;
                      }
LAB_0053f2fb:
                      lVar23 = lVar23 * (iVar38 - iVar33);
LAB_0053f30b:
                      *(undefined4 *)
                       ((long)piVar19 +
                       lVar25 * 4 + lVar28 * 4 * lVar43 + lVar23 * 4 + lVar21 * -4 + lVar36) =
                           *(undefined4 *)
                            ((long)piVar19 +
                            lVar25 * 4 +
                            (long)(local_114 - iVar34) * lVar28 * 4 + lVar23 * 4 + lVar21 * -4 +
                            lVar36);
                    }
                  }
                  else {
                    bVar2 = bfhi->arr[2];
                    if (bflo->arr[0] != false) {
                      piVar19 = a->p;
                      lVar23 = a->jstride;
                      iVar34 = (a->begin).x;
                      lVar21 = (long)iVar34;
                      lVar43 = (long)((iVar13 + iVar33) - iVar34);
                      iVar33 = (a->begin).y;
                      iVar34 = (a->begin).z;
                      lVar28 = a->kstride;
                      if (bflo->arr[1] == false) {
                        lVar23 = lVar23 * (iVar26 - iVar33);
                        if (bVar2 != false) {
                          iVar39 = piVar19[lVar23 + lVar43 + (iVar14 - iVar34) * lVar28];
                          goto LAB_0053f162;
                        }
                        lVar28 = lVar28 * (iVar38 - iVar34);
                        iVar34 = piVar19[lVar23 + lVar43 + lVar28];
                      }
                      else {
                        lVar41 = (iVar17 - iVar33) * lVar23;
                        if (bVar2 != false) {
                          iVar46 = piVar19[lVar41 + lVar43 + (iVar14 - iVar34) * lVar28];
                          lVar23 = (lVar40 - iVar34) * lVar28 * 4 + lVar23 * (iVar26 - iVar33) * 4;
                          goto LAB_0053ea64;
                        }
                        lVar28 = lVar28 * (iVar38 - iVar34);
                        iVar34 = piVar19[lVar41 + lVar43 + lVar28];
                        lVar23 = lVar23 * (iVar26 - iVar33);
                      }
                      goto LAB_0053f353;
                    }
                    if (bflo->arr[1] == false) {
                      if (bVar2 == false) goto LAB_0053ece4;
LAB_0053f181:
                      if (bfhi->arr[2] != true) goto LAB_0053ec5b;
LAB_0053f190:
                      lVar28 = (long)(a->begin).x;
                      iVar33 = (a->begin).z;
                      lVar23 = ((long)iVar26 - (long)(a->begin).y) * a->jstride;
                      lVar21 = a->kstride * 4;
                      piVar19 = a->p + lVar35;
                      iVar34 = *(int *)((long)piVar19 +
                                       lVar25 * 4 +
                                       (iVar44 - iVar33) * lVar21 + lVar23 * 4 + lVar28 * -4);
                      iVar39 = iVar38;
                      goto LAB_0053e940;
                    }
                    piVar19 = a->p;
                    lVar28 = a->jstride;
                    lVar21 = (long)(a->begin).x;
                    iVar34 = (a->begin).y;
                    iVar33 = (a->begin).z;
                    lVar23 = a->kstride;
                    lVar43 = (long)(iVar26 - iVar34);
                    if (bVar2 == false) goto LAB_0053f2fb;
                    lVar23 = lVar23 * 4;
                    lVar28 = lVar28 * 4;
                    piVar19 = piVar19 + lVar35;
                    uVar32 = *(undefined4 *)
                              ((long)piVar19 +
                              lVar25 * 4 +
                              (local_114 - iVar34) * lVar28 + (iVar44 - iVar33) * lVar23 +
                              lVar21 * -4);
LAB_0053ef38:
                    *(undefined4 *)
                     ((long)piVar19 +
                     lVar25 * 4 + (iVar38 - iVar33) * lVar23 + lVar28 * lVar43 + lVar21 * -4) =
                         uVar32;
                  }
                }
                else {
                  cVar42 = bfhi->arr[1];
                  cVar37 = bflo->arr[2];
                  if (bflo->arr[0] != false) {
                    piVar19 = a->p;
                    lVar23 = a->jstride;
                    iVar34 = (a->begin).x;
                    iVar39 = iVar13;
LAB_0053e9f3:
                    lVar21 = (long)iVar34;
                    lVar43 = (long)((iVar39 + iVar33) - iVar34);
                    iVar33 = (a->begin).y;
                    iVar34 = (a->begin).z;
                    lVar28 = a->kstride;
                    iVar39 = iVar31;
                    if (cVar42 == '\0') goto LAB_0053eade;
                    piVar24 = piVar19 + (iVar16 - iVar33) * lVar23 + lVar43;
LAB_0053ea2b:
                    if (cVar37 != '\0') {
                      iVar46 = piVar24[(iVar15 - iVar34) * lVar28];
                      lVar23 = lVar23 * (iVar39 - iVar33) * 4 + (local_128 - iVar34) * lVar28 * 4;
LAB_0053ea64:
                      *(int *)((long)piVar19 + lVar25 * 4 + lVar23 + lVar21 * -4 + lVar36) = iVar46;
                      goto LAB_0053ec5b;
                    }
                    lVar28 = lVar28 * (local_128 - iVar34);
                    iVar34 = piVar24[lVar28];
                    lVar23 = lVar23 * (iVar39 - iVar33);
                    goto LAB_0053eb4a;
                  }
                  if ((bool)cVar42 != false) {
LAB_0053eb72:
                    piVar19 = a->p;
                    lVar28 = a->jstride;
                    lVar21 = (long)(a->begin).x;
                    iVar33 = (a->begin).y;
                    iVar39 = (a->begin).z;
                    lVar23 = a->kstride;
                    lVar43 = (long)(iVar31 - iVar33);
                    if (cVar37 != '\0') {
                      lVar23 = lVar23 * 4;
                      lVar41 = (local_118 - iVar39) * lVar23;
                      iVar46 = local_11c;
                      goto LAB_0053ebb4;
                    }
                    iVar39 = local_128 - iVar39;
LAB_0053ec1b:
                    lVar23 = lVar23 * iVar39;
                    iVar34 = local_11c;
                    goto LAB_0053ec28;
                  }
                  if ((bool)cVar37 == false) goto LAB_0053e9ac;
LAB_0053ec68:
                  if (bflo->arr[2] != true) goto LAB_0053ec5b;
LAB_0053ec6f:
                  lVar23 = (long)(a->begin).x;
                  iVar33 = (a->begin).z;
                  lVar28 = ((long)iVar31 - (long)(a->begin).y) * a->jstride;
                  lVar21 = a->kstride * 4;
                  piVar19 = a->p + lVar35;
                  uVar32 = *(undefined4 *)
                            ((long)piVar19 +
                            lVar25 * 4 + (local_118 - iVar33) * lVar21 + lVar28 * 4 + lVar23 * -4);
LAB_0053ecb6:
                  *(undefined4 *)
                   ((long)piVar19 +
                   lVar25 * 4 + (iVar34 - iVar33) * lVar21 + lVar28 * 4 + lVar23 * -4) = uVar32;
                }
              }
              else {
                cVar37 = bflo->arr[2];
                if (bfhi->arr[0] != false) {
                  piVar19 = a->p;
                  lVar23 = a->jstride;
                  iVar34 = (a->begin).x;
                  lVar21 = (long)iVar34;
                  lVar43 = (long)((iVar11 + iVar33) - iVar34);
                  iVar33 = (a->begin).y;
                  iVar34 = (a->begin).z;
                  lVar28 = a->kstride;
                  iVar39 = iVar26;
                  if (bflo->arr[1] != false) {
                    piVar24 = piVar19 + (iVar17 - iVar33) * lVar23 + lVar43;
                    goto LAB_0053ea2b;
                  }
LAB_0053eade:
                  lVar23 = lVar23 * (iVar39 - iVar33);
                  if (cVar37 == '\0') {
                    lVar28 = lVar28 * (local_128 - iVar34);
                    iVar34 = piVar19[lVar23 + lVar43 + lVar28];
                    goto LAB_0053eb4a;
                  }
                  iVar39 = piVar19[lVar23 + lVar43 + (iVar15 - iVar34) * lVar28];
                  iVar33 = local_128;
LAB_0053eb0d:
                  iVar33 = iVar33 - iVar34;
LAB_0053eb10:
                  lVar28 = iVar33 * lVar28;
LAB_0053eb17:
                  lVar23 = lVar23 * 4 + lVar28 * 4;
LAB_0053eb1f:
                  *(int *)((long)piVar19 + lVar25 * 4 + lVar23 + lVar21 * -4 + lVar36) = iVar39;
                  goto LAB_0053ec5b;
                }
                if (bflo->arr[1] == false) {
                  if ((bool)cVar37 != false) goto LAB_0053e8ee;
                  goto LAB_0053e959;
                }
                piVar19 = a->p;
                lVar28 = a->jstride;
                lVar21 = (long)(a->begin).x;
                iVar33 = (a->begin).y;
                iVar39 = (a->begin).z;
                lVar23 = a->kstride;
                lVar43 = (long)(iVar26 - iVar33);
                if ((bool)cVar37 == false) goto LAB_0053ec01;
                lVar23 = lVar23 * 4;
                lVar41 = (local_118 - iVar39) * lVar23;
                iVar46 = local_114;
LAB_0053ebb4:
                lVar28 = lVar28 * 4;
                piVar19 = piVar19 + lVar35;
                uVar32 = *(undefined4 *)
                          ((long)piVar19 +
                          lVar25 * 4 + (iVar46 - iVar33) * lVar28 + lVar41 + lVar21 * -4);
LAB_0053ebd9:
                *(undefined4 *)
                 ((long)piVar19 +
                 lVar25 * 4 + lVar28 * lVar43 + (iVar34 - iVar39) * lVar23 + lVar21 * -4) = uVar32;
              }
            }
            else {
              bVar51 = bflo->arr[2];
              if (bflo->arr[0] == false) {
                if (bflo->arr[1] != false) {
                  piVar19 = a->p;
                  lVar28 = a->jstride;
                  lVar21 = (long)(a->begin).x;
                  iVar33 = (a->begin).y;
                  iVar39 = (a->begin).z;
                  lVar23 = a->kstride;
                  lVar43 = (long)(iVar26 - iVar33);
                  if (bVar51 == false) {
LAB_0053ec01:
                    lVar23 = lVar23 * (local_128 - iVar39);
                    iVar34 = local_114;
LAB_0053ec28:
                    iVar34 = iVar34 - iVar33;
LAB_0053ec2b:
                    piVar19 = piVar19 + lVar35;
                    uVar32 = *(undefined4 *)
                              ((long)piVar19 +
                              lVar25 * 4 + (long)iVar34 * lVar28 * 4 + lVar23 * 4 + lVar21 * -4);
                    lVar23 = lVar28 * 4 * lVar43 + lVar23 * 4;
                  }
                  else {
                    lVar23 = lVar23 * 4;
                    lVar28 = lVar28 * 4;
                    piVar19 = piVar19 + lVar35;
                    uVar32 = *(undefined4 *)
                              ((long)piVar19 +
                              lVar25 * 4 +
                              (local_114 - iVar33) * lVar28 + (local_118 - iVar39) * lVar23 +
                              lVar21 * -4);
                    iVar33 = local_128;
LAB_0053e7b7:
                    lVar23 = lVar28 * lVar43 + (iVar33 - iVar39) * lVar23;
                  }
                  *(undefined4 *)((long)piVar19 + lVar25 * 4 + lVar23 + lVar21 * -4) = uVar32;
                  goto LAB_0053ec5b;
                }
                if (bVar51 == false) goto LAB_0053e814;
LAB_0053e8ee:
                if (bflo->arr[2] != true) goto LAB_0053ec5b;
LAB_0053e8f9:
                lVar28 = (long)(a->begin).x;
                iVar33 = (a->begin).z;
                lVar23 = ((long)iVar26 - (long)(a->begin).y) * a->jstride;
                lVar21 = a->kstride * 4;
                piVar19 = a->p + lVar35;
                iVar34 = *(int *)((long)piVar19 +
                                 lVar25 * 4 +
                                 (local_118 - iVar33) * lVar21 + lVar23 * 4 + lVar28 * -4);
                iVar39 = local_128;
LAB_0053e940:
                lVar23 = (iVar39 - iVar33) * lVar21 + lVar23 * 4 + lVar28 * -4 + (long)piVar19;
              }
              else {
                piVar19 = a->p;
                lVar23 = a->jstride;
                iVar34 = (a->begin).x;
                lVar21 = (long)iVar34;
                lVar43 = (long)((iVar13 + iVar33) - iVar34);
                iVar34 = (a->begin).y;
                iVar33 = (a->begin).z;
                lVar28 = a->kstride;
                if (bflo->arr[1] == false) {
                  lVar23 = lVar23 * (iVar26 - iVar34);
                  piVar24 = piVar19 + lVar23 + lVar43;
                  if (bVar51 != false) {
                    iVar39 = piVar24[(iVar15 - iVar33) * lVar28];
                    iVar33 = local_128 - iVar33;
                    goto LAB_0053eb10;
                  }
                  iVar33 = local_128 - iVar33;
LAB_0053eacc:
                  lVar28 = lVar28 * iVar33;
                  iVar34 = piVar24[lVar28];
                }
                else {
                  piVar24 = piVar19 + (iVar17 - iVar34) * lVar23 + lVar43;
                  lVar43 = (long)(iVar26 - iVar34);
                  if (bVar51 != false) {
                    iVar39 = piVar24[(iVar15 - iVar33) * lVar28];
                    lVar23 = lVar23 * lVar43 * 4 + (lVar27 - iVar33) * lVar28 * 4;
                    goto LAB_0053eb1f;
                  }
                  iVar33 = local_128 - iVar33;
LAB_0053eaa0:
                  lVar28 = lVar28 * iVar33;
                  iVar34 = piVar24[lVar28];
                  lVar23 = lVar23 * lVar43;
                }
LAB_0053eb4a:
                lVar23 = lVar23 * 4 + lVar28 * 4;
LAB_0053eb52:
                lVar23 = (long)piVar19 + lVar23 + lVar21 * -4 + lVar36;
              }
              *(int *)(lVar23 + lVar25 * 4) = iVar34;
            }
          }
LAB_0053ec5b:
          lVar25 = lVar25 + 1;
        }
        local_114 = local_114 + 1;
        local_11c = local_11c + 1;
      }
      local_118 = local_118 + 1;
      iVar44 = iVar44 + 1;
    }
  }
  return;
}

Assistant:

inline void mlndlap_bc_doit (Box const& vbx, Array4<T> const& a, Box const& domain,
                             GpuArray<bool,AMREX_SPACEDIM> const& bflo,
                             GpuArray<bool,AMREX_SPACEDIM> const& bfhi) noexcept
{
    Box gdomain = domain;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (! bflo[idim]) gdomain.growLo(idim,1);
        if (! bfhi[idim]) gdomain.growHi(idim,1);
    }

    if (gdomain.strictly_contains(vbx)) return;

    const int offset = domain.cellCentered() ? 0 : 1;

    const auto dlo = amrex::lbound(domain);
    const auto dhi = amrex::ubound(domain);

    Box const& sbox = amrex::grow(vbx,1);
    AMREX_HOST_DEVICE_FOR_3D(sbox, i, j, k,
    {
        if (! gdomain.contains(IntVect(i,j,k))) {
            // xlo & ylo & zlo
            if (i == dlo.x-1 && j == dlo.y-1 && k == dlo.z-1 && (bflo[0] || bflo[1] || bflo[2]))
            {
                if (bflo[0] && bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k+1+offset);
                }
                else if (bflo[0] && bflo[1])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k);
                }
                else if (bflo[0] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k+1+offset);
                }
                else if (bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k+1+offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xhi & ylo & zlo
            else if (i == dhi.x+1 && j == dlo.y-1 && k == dlo.z-1 && (bfhi[0] || bflo[1] || bflo[2]))
            {
                if (bfhi[0] && bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k+1+offset);
                }
                else if (bfhi[0] && bflo[1])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k);
                }
                else if (bfhi[0] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k+1+offset);
                }
                else if (bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k+1+offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xlo & yhi & zlo
            else if (i == dlo.x-1 && j == dhi.y+1 && k == dlo.z-1 && (bflo[0] || bfhi[1] || bflo[2]))
            {
                if (bflo[0] && bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k+1+offset);
                }
                else if (bflo[0] && bfhi[1])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k);
                }
                else if (bflo[0] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k+1+offset);
                }
                else if (bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k+1+offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xhi & yhi & zlo
            else if (i == dhi.x+1 && j == dhi.y+1 && k == dlo.z-1 && (bfhi[0] || bfhi[1] || bflo[2]))
            {
                if (bfhi[0] && bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k+1+offset);
                }
                else if (bfhi[0] && bfhi[1])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k);
                }
                else if (bfhi[0] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k+1+offset);
                }
                else if (bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k+1+offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xlo & ylo & zhi
            else if (i == dlo.x-1 && j == dlo.y-1 && k == dhi.z+1 && (bflo[0] || bflo[1] || bfhi[2]))
            {
                if (bflo[0] && bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k-1-offset);
                }
                else if (bflo[0] && bflo[1])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k);
                }
                else if (bflo[0] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k-1-offset);
                }
                else if (bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k-1-offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xhi & ylo & zhi
            else if (i == dhi.x+1 && j == dlo.y-1 && k == dhi.z+1 && (bfhi[0] || bflo[1] || bfhi[2]))
            {
                if (bfhi[0] && bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k-1-offset);
                }
                else if (bfhi[0] && bflo[1])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k);
                }
                else if (bfhi[0] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k-1-offset);
                }
                else if (bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k-1-offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xlo & yhi & zhi
            else if (i == dlo.x-1 && j == dhi.y+1 && k == dhi.z+1 && (bflo[0] || bfhi[1] || bfhi[2]))
            {
                if (bflo[0] && bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k-1-offset);
                }
                else if (bflo[0] && bfhi[1])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k);
                }
                else if (bflo[0] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k-1-offset);
                }
                else if (bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k-1-offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xhi & yhi & zhi
            else if (i == dhi.x+1 && j == dhi.y+1 && k == dhi.z+1 && (bfhi[0] || bfhi[1] || bfhi[2]))
            {
                if (bfhi[0] && bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k-1-offset);
                }
                else if (bfhi[0] && bfhi[1])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k);
                }
                else if (bfhi[0] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k-1-offset);
                }
                else if (bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k-1-offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xlo & ylo
            else if (i == dlo.x-1 && j == dlo.y-1 && (bflo[0] || bflo[1]))
            {
                if (bflo[0] && bflo[1])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
            }
            // xhi & ylo
            else if (i == dhi.x+1 && j == dlo.y-1 && (bfhi[0] || bflo[1]))
            {
                if (bfhi[0] && bflo[1])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
            }
            // xlo & yhi
            else if (i == dlo.x-1 && j == dhi.y+1 && (bflo[0] || bfhi[1]))
            {
                if (bflo[0] && bfhi[1])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
            }
            // xhi & yhi
            else if (i == dhi.x+1 && j == dhi.y+1 && (bfhi[0] || bfhi[1]))
            {
                if (bfhi[0] && bfhi[1])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
            }
            // xlo & zlo
            else if (i == dlo.x-1 && k == dlo.z-1 && (bflo[0] || bflo[2]))
            {
                if (bflo[0] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k+1+offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xhi & zlo
            else if (i == dhi.x+1 && k == dlo.z-1 && (bfhi[0] || bflo[2]))
            {
                if (bfhi[0] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k+1+offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xlo & zhi
            else if (i == dlo.x-1 && k == dhi.z+1 && (bflo[0] || bfhi[2]))
            {
                if (bflo[0] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k-1-offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xhi & zhi
            else if (i == dhi.x+1 && k == dhi.z+1 && (bfhi[0] || bfhi[2]))
            {
                if (bfhi[0] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k-1-offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // ylo & zlo
            else if (j == dlo.y-1 && k == dlo.z-1 && (bflo[1] || bflo[2]))
            {
                if (bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k+1+offset);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // yhi & zlo
            else if (j == dhi.y+1 && k == dlo.z-1 && (bfhi[1] || bflo[2]))
            {
                if (bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k+1+offset);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // ylo & zhi
            else if (j == dlo.y-1 && k == dhi.z+1 && (bflo[1] || bfhi[2]))
            {
                if (bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k-1-offset);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // yhi & zhi
            else if (j == dhi.y+1 && k == dhi.z+1 && (bfhi[1] || bfhi[2]))
            {
                if (bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k-1-offset);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            else if (i == dlo.x-1 && bflo[0])
            {
                a(i,j,k) = a(i+1+offset, j, k);
            }
            else if (i == dhi.x+1 && bfhi[0])
            {
                a(i,j,k) = a(i-1-offset, j, k);
            }
            else if (j == dlo.y-1 && bflo[1])
            {
                a(i,j,k) = a(i, j+1+offset, k);
            }
            else if (j == dhi.y+1 && bfhi[1])
            {
                a(i,j,k) = a(i, j-1-offset, k);
            }
            else if (k == dlo.z-1 && bflo[2])
            {
                a(i,j,k) = a(i, j, k+1+offset);
            }
            else if (k == dhi.z+1 && bfhi[2])
            {
                a(i,j,k) = a(i, j, k-1-offset);
            }
        }
    });
}